

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O1

ssl_verify_result_t bssl::ssl_verify_peer_cert(SSL_HANDSHAKE *hs)

{
  ssl_session_st *psVar1;
  tuple<crypto_buffer_st_*,_bssl::internal::Deleter> tVar2;
  _func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *p_Var3;
  ssl_ctx_st *psVar4;
  _func_int_SSL_ptr_void_ptr *p_Var5;
  int iVar6;
  ssl_verify_result_t sVar7;
  size_t sVar8;
  size_t sVar9;
  CRYPTO_BUFFER *buf;
  CRYPTO_BUFFER *buf_00;
  uint8_t *__s1;
  uint8_t *__s2;
  size_t sVar10;
  uint desc;
  pointer __p;
  SSL *ssl;
  difference_type __d1;
  bool bVar11;
  uint8_t alert;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_40;
  SSL *local_38;
  
  ssl = hs->ssl;
  psVar1 = (ssl->s3->established_session)._M_t.
           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  if (psVar1 == (ssl_session_st *)0x0) {
    local_40._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._0_1_ = 0x2e;
    p_Var3 = hs->config->custom_verify_callback;
    if (p_Var3 == (_func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *)0x0) {
      bVar11 = (*((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                 session_verify_cert_chain)
                         ((hs->new_session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,hs,
                          (uint8_t *)&local_40);
      sVar7 = (ssl_verify_result_t)!bVar11;
    }
    else {
      sVar7 = (*p_Var3)(ssl,(uint8_t *)&local_40);
      if (sVar7 == ssl_verify_invalid) {
        bVar11 = hs->config->verify_mode != '\0';
        if (!bVar11) {
          ERR_clear_error();
        }
        sVar7 = (ssl_verify_result_t)bVar11;
        ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->verify_result = 0x32;
      }
      else if (sVar7 == ssl_verify_ok) {
        ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->verify_result = 0;
        sVar7 = ssl_verify_ok;
      }
    }
    if (sVar7 == ssl_verify_ok) {
      if ((ssl->field_0xa4 & 1) != 0) {
        return ssl_verify_ok;
      }
      if ((hs->config->field_0x10d & 4) == 0) {
        return ssl_verify_ok;
      }
      psVar4 = (ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
      p_Var5 = psVar4->legacy_ocsp_callback;
      if (p_Var5 == (_func_int_SSL_ptr_void_ptr *)0x0) {
        return ssl_verify_ok;
      }
      iVar6 = (*p_Var5)(ssl,psVar4->legacy_ocsp_callback_arg);
      if (0 < iVar6) {
        return ssl_verify_ok;
      }
      ERR_put_error(0x10,0,0x121,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0x134);
      desc = 0x50;
      if (iVar6 == 0) {
        desc = 0x71;
      }
    }
    else {
      if (sVar7 != ssl_verify_invalid) {
        return sVar7;
      }
      ERR_put_error(0x10,0,0x7d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0x128);
      desc = (uint)(byte)local_40._M_t.
                         super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
    }
    ssl_send_alert(ssl,2,desc);
    return ssl_verify_invalid;
  }
  if ((ssl->field_0xa4 & 1) != 0) {
    __assert_fail("!ssl->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                  ,0xec,"enum ssl_verify_result_t bssl::ssl_verify_peer_cert(SSL_HANDSHAKE *)");
  }
  sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)
                         (psVar1->certs)._M_t.
                         super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>);
  sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)
                         (((hs->new_session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs)._M_t
                         .super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>);
  if (sVar8 != sVar9) {
    ERR_put_error(0x10,0,0x111,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                  ,0xef);
LAB_0014478f:
    ssl_send_alert(ssl,2,0x2f);
    return ssl_verify_invalid;
  }
  local_38 = ssl;
  sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)
                         (((hs->new_session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs)._M_t
                         .super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>);
  if (sVar8 != 0) {
    sVar8 = 0;
    do {
      buf = (CRYPTO_BUFFER *)
            OPENSSL_sk_value((OPENSSL_STACK *)
                             (psVar1->certs)._M_t.
                             super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>,
                             sVar8);
      buf_00 = (CRYPTO_BUFFER *)
               OPENSSL_sk_value((OPENSSL_STACK *)
                                (((hs->new_session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                certs)._M_t.
                                super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                ,sVar8);
      __s1 = CRYPTO_BUFFER_data(buf);
      sVar9 = CRYPTO_BUFFER_len(buf);
      __s2 = CRYPTO_BUFFER_data(buf_00);
      sVar10 = CRYPTO_BUFFER_len(buf_00);
      if ((sVar9 != sVar10) || ((sVar9 != 0 && (iVar6 = bcmp(__s1,__s2,sVar9), iVar6 != 0)))) {
        ERR_put_error(0x10,0,0x111,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0xfc);
        ssl = local_38;
        goto LAB_0014478f;
      }
      sVar8 = sVar8 + 1;
      sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)
                             (((hs->new_session)._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs).
                             _M_t.
                             super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>)
      ;
    } while (sVar8 < sVar9);
  }
  tVar2.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
        &(psVar1->ocsp_response)._M_t.
         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>;
  if (tVar2.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
      (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
    CRYPTO_BUFFER_up_ref
              ((CRYPTO_BUFFER *)
               tVar2.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
  }
  local_40._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)0x0;
  std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
             &((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
               ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ocsp_response,
             (pointer)tVar2.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_40);
  tVar2.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
        &(psVar1->signed_cert_timestamp_list)._M_t.
         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>;
  if (tVar2.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
      (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
    CRYPTO_BUFFER_up_ref
              ((CRYPTO_BUFFER *)
               tVar2.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
  }
  local_40._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)0x0;
  std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
             &((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
               ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
              signed_cert_timestamp_list,
             (pointer)tVar2.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_40);
  ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->verify_result =
       psVar1->verify_result;
  return ssl_verify_ok;
}

Assistant:

enum ssl_verify_result_t ssl_verify_peer_cert(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  const SSL_SESSION *prev_session = ssl->s3->established_session.get();
  if (prev_session != NULL) {
    // If renegotiating, the server must not change the server certificate. See
    // https://mitls.org/pages/attacks/3SHAKE. We never resume on renegotiation,
    // so this check is sufficient to ensure the reported peer certificate never
    // changes on renegotiation.
    assert(!ssl->server);
    if (sk_CRYPTO_BUFFER_num(prev_session->certs.get()) !=
        sk_CRYPTO_BUFFER_num(hs->new_session->certs.get())) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_SERVER_CERT_CHANGED);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return ssl_verify_invalid;
    }

    for (size_t i = 0; i < sk_CRYPTO_BUFFER_num(hs->new_session->certs.get());
         i++) {
      const CRYPTO_BUFFER *old_cert =
          sk_CRYPTO_BUFFER_value(prev_session->certs.get(), i);
      const CRYPTO_BUFFER *new_cert =
          sk_CRYPTO_BUFFER_value(hs->new_session->certs.get(), i);
      if (Span(CRYPTO_BUFFER_data(old_cert), CRYPTO_BUFFER_len(old_cert)) !=
          Span(CRYPTO_BUFFER_data(new_cert), CRYPTO_BUFFER_len(new_cert))) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_SERVER_CERT_CHANGED);
        ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
        return ssl_verify_invalid;
      }
    }

    // The certificate is identical, so we may skip re-verifying the
    // certificate. Since we only authenticated the previous one, copy other
    // authentication from the established session and ignore what was newly
    // received.
    hs->new_session->ocsp_response = UpRef(prev_session->ocsp_response);
    hs->new_session->signed_cert_timestamp_list =
        UpRef(prev_session->signed_cert_timestamp_list);
    hs->new_session->verify_result = prev_session->verify_result;
    return ssl_verify_ok;
  }

  uint8_t alert = SSL_AD_CERTIFICATE_UNKNOWN;
  enum ssl_verify_result_t ret;
  if (hs->config->custom_verify_callback != nullptr) {
    ret = hs->config->custom_verify_callback(ssl, &alert);
    switch (ret) {
      case ssl_verify_ok:
        hs->new_session->verify_result = X509_V_OK;
        break;
      case ssl_verify_invalid:
        // If |SSL_VERIFY_NONE|, the error is non-fatal, but we keep the result.
        if (hs->config->verify_mode == SSL_VERIFY_NONE) {
          ERR_clear_error();
          ret = ssl_verify_ok;
        }
        hs->new_session->verify_result = X509_V_ERR_APPLICATION_VERIFICATION;
        break;
      case ssl_verify_retry:
        break;
    }
  } else {
    ret = ssl->ctx->x509_method->session_verify_cert_chain(
              hs->new_session.get(), hs, &alert)
              ? ssl_verify_ok
              : ssl_verify_invalid;
  }

  if (ret == ssl_verify_invalid) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CERTIFICATE_VERIFY_FAILED);
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
  }

  // Emulate OpenSSL's client OCSP callback. OpenSSL verifies certificates
  // before it receives the OCSP, so it needs a second callback for OCSP.
  if (ret == ssl_verify_ok && !ssl->server &&
      hs->config->ocsp_stapling_enabled &&
      ssl->ctx->legacy_ocsp_callback != nullptr) {
    int cb_ret =
        ssl->ctx->legacy_ocsp_callback(ssl, ssl->ctx->legacy_ocsp_callback_arg);
    if (cb_ret <= 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_OCSP_CB_ERROR);
      ssl_send_alert(ssl, SSL3_AL_FATAL,
                     cb_ret == 0 ? SSL_AD_BAD_CERTIFICATE_STATUS_RESPONSE
                                 : SSL_AD_INTERNAL_ERROR);
      ret = ssl_verify_invalid;
    }
  }

  return ret;
}